

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionProxy::SetAuxPtr(FunctionProxy *this,AuxPointerType e,void *ptr)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  undefined4 *puVar4;
  void *pvVar5;
  CriticalSection *this_00;
  
  pTVar3 = ThreadContext::GetContextForCurrentThread();
  if ((pTVar3 == (ThreadContext *)0x0) &&
     (bVar2 = CCLock::IsLocked(&ThreadContext::s_csThreadContext.super_CCLock), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b,
                                "(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked())"
                                ,
                                "ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((ptr == (void *)0x0) && (pvVar5 = GetAuxPtr(this,e), pvVar5 == (void *)0x0)) {
    return;
  }
  this_00 = &this->m_scriptContext->threadContext->csFunctionBody;
  CCLock::Enter(&this_00->super_CCLock);
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::SetAuxPtr(this,e,ptr);
  CCLock::Leave(&this_00->super_CCLock);
  return;
}

Assistant:

void FunctionProxy::SetAuxPtr(AuxPointerType e, void* ptr)
    {
        // On process detach this can be called from another thread but the ThreadContext should be locked
        Assert(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked());

        if (ptr == nullptr && GetAuxPtr(e) == nullptr)
        {
            return;
        }

        // when setting ptr to null we never need to promote
        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        AuxPtrsT::SetAuxPtr(this, e, ptr);
    }